

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<MaterialDataV>::Resize(TPZVec<MaterialDataV> *this,int64_t newsize)

{
  long lVar1;
  long lVar2;
  MaterialDataV *pMVar3;
  undefined1 auVar4 [16];
  ostream *this_00;
  void *this_01;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong in_RSI;
  long in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t large;
  MaterialDataV *newstore;
  MaterialDataV *in_stack_ffffffffffffff18;
  MaterialDataV *in_stack_ffffffffffffff20;
  MaterialDataV *this_02;
  MaterialDataV *in_stack_ffffffffffffff30;
  double dVar9;
  ulong local_a8;
  ulong *local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar1 = *(long *)(in_RDI + 8);
      if (lVar1 != 0) {
        lVar2 = *(long *)(lVar1 + -8);
        for (lVar5 = lVar1 + lVar2 * 0x98; lVar1 != lVar5; lVar5 = lVar5 + -0x98) {
          MaterialDataV::~MaterialDataV(in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar1 + -8),lVar2 * 0x98 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_RSI;
      uVar6 = SUB168(auVar4 * ZEXT816(0x98),0);
      uVar8 = uVar6 + 8;
      if (SUB168(auVar4 * ZEXT816(0x98),8) != 0 || 0xfffffffffffffff7 < uVar6) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar7 = (ulong *)operator_new__(uVar8);
      *puVar7 = in_RSI;
      puVar7 = puVar7 + 1;
      if (in_RSI != 0) {
        local_90 = puVar7;
        do {
          MaterialDataV::MaterialDataV(in_stack_ffffffffffffff30);
          local_90 = local_90 + 0x13;
        } while (local_90 != puVar7 + in_RSI * 0x13);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        MaterialDataV::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pMVar3 = *(MaterialDataV **)(in_RDI + 8), pMVar3 != (MaterialDataV *)0x0)) {
        dVar9 = pMVar3[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
        this_02 = pMVar3 + (long)dVar9;
        while (pMVar3 != this_02) {
          this_02 = this_02 + -1;
          MaterialDataV::~MaterialDataV(this_02);
        }
        operator_delete__(pMVar3[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                          (long)dVar9 * 0x98 + 8);
      }
      *(ulong **)(in_RDI + 8) = puVar7;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}